

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caption.c
# Opt level: O2

libcaption_stauts_t caption_frame_decode_midrowchange(caption_frame_t *frame,uint16_t cc_data)

{
  int iVar1;
  int unl;
  eia608_style_t sty;
  int chn;
  
  iVar1 = eia608_parse_midrowchange(cc_data,&chn,&sty,&unl);
  if (iVar1 != 0) {
    *(byte *)&frame->state =
         (byte)unl & 1 | *(byte *)&frame->state & 0xf0 | (undefined1)sty * '\x02' & 0xeU;
  }
  return LIBCAPTION_OK;
}

Assistant:

libcaption_stauts_t caption_frame_decode_midrowchange(caption_frame_t* frame, uint16_t cc_data)
{
    eia608_style_t sty;
    int chn, unl;

    if (eia608_parse_midrowchange(cc_data, &chn, &sty, &unl)) {
        frame->state.sty = sty;
        frame->state.uln = unl;
    }

    return LIBCAPTION_OK;
}